

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  char *__s2;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_280;
  size_t local_278;
  char *local_270;
  ulong local_268;
  MatchState local_260;
  
  pcVar4 = luaL_checklstring(L,1,&local_268);
  pcVar5 = luaL_checklstring(L,2,&local_280);
  uVar6 = luaL_optinteger(L,3,1);
  uVar9 = 1;
  if ((long)uVar6 < 0) {
    if (-uVar6 <= local_268) {
      uVar6 = uVar6 + local_268 + 1;
      goto LAB_0011a646;
    }
  }
  else {
LAB_0011a646:
    if ((uVar6 != 0) && (uVar9 = uVar6, local_268 + 1 < uVar6)) goto LAB_0011a7ed;
  }
  local_278 = CONCAT44(local_278._4_4_,find);
  uVar6 = local_280;
  if (find == 0) {
LAB_0011a770:
    cVar1 = *pcVar5;
    if (cVar1 == '^') {
      pcVar5 = pcVar5 + 1;
      uVar6 = uVar6 - 1;
      local_280 = uVar6;
    }
    local_260.matchdepth = 200;
    local_260.src_end = pcVar4 + local_268;
    local_260.p_end = pcVar5 + uVar6;
    local_260.src_init = pcVar4;
    local_260.L = L;
    do {
      lVar2 = uVar9 - 1;
      local_260.level = 0;
      pcVar10 = match(&local_260,pcVar4 + lVar2,pcVar5);
      if (pcVar10 != (char *)0x0) {
        if ((int)local_278 != 0) {
          lua_pushinteger(L,uVar9);
          lua_pushinteger(L,(long)pcVar10 - (long)pcVar4);
          iVar3 = push_captures(&local_260,(char *)0x0,(char *)0x0);
          return iVar3 + 2;
        }
        iVar3 = push_captures(&local_260,pcVar4 + (uVar9 - 1),pcVar10);
        return iVar3;
      }
    } while ((cVar1 != '^') && (uVar9 = uVar9 + 1, pcVar4 + lVar2 < local_260.src_end));
  }
  else {
    local_270 = pcVar5;
    iVar3 = lua_toboolean(L,4);
    uVar6 = local_280;
    if (iVar3 == 0) {
      uVar11 = 0;
      do {
        pcVar10 = local_270 + uVar11;
        pcVar7 = strpbrk(pcVar10,"^$*+?.([%-");
        pcVar5 = local_270;
        if (pcVar7 != (char *)0x0) goto LAB_0011a770;
        sVar8 = strlen(pcVar10);
        uVar11 = uVar11 + sVar8 + 1;
      } while (uVar11 <= uVar6);
    }
    pcVar5 = pcVar4 + (uVar9 - 1);
    if (uVar6 == 0) {
LAB_0011a85c:
      lua_pushinteger(L,(lua_Integer)(pcVar5 + (1 - (long)pcVar4)));
      lua_pushinteger(L,(lua_Integer)(pcVar5 + (local_280 - (long)pcVar4)));
      return 2;
    }
    uVar9 = (local_268 - uVar9) + 1;
    if (uVar6 <= uVar9) {
      local_278 = uVar6 - 1;
      pcVar10 = (char *)(uVar9 - local_278);
      if (pcVar10 != (char *)0x0) {
        cVar1 = *local_270;
        __s2 = local_270 + 1;
        pcVar7 = pcVar5;
        do {
          pcVar5 = (char *)memchr(pcVar7,(int)cVar1,(size_t)pcVar10);
          if (pcVar5 == (char *)0x0) break;
          __s1 = pcVar5 + 1;
          iVar3 = bcmp(__s1,__s2,local_278);
          if (iVar3 == 0) goto LAB_0011a85c;
          pcVar10 = pcVar7 + ((long)pcVar10 - (long)__s1);
          pcVar7 = __s1;
        } while (pcVar10 != (char *)0x0);
      }
    }
  }
LAB_0011a7ed:
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelat(luaL_optinteger(L, 3, 1), ls);
  if (init < 1) init = 1;
  else if (init > ls + 1) {  /* start after string's end? */
    lua_pushnil(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init - 1, ls - init + 1, p, lp);
    if (s2) {
      lua_pushinteger(L, s2 - s + 1);
      lua_pushinteger(L, s2 - s + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init - 1;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    ms.L = L;
    ms.matchdepth = MAXCCALLS;
    ms.src_init = s;
    ms.src_end = s + ls;
    ms.p_end = p + lp;
    do {
      const char *res;
      ms.level = 0;
      lua_assert(ms.matchdepth == MAXCCALLS);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1 - s + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}